

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

bool cmSystemTools::IsOn(char *val)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  reference pcVar4;
  size_type sVar5;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar6;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_180;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_178;
  iterator c;
  allocator local_159;
  value_type local_158;
  _Base_ptr local_138;
  undefined1 local_130;
  allocator local_121;
  value_type local_120;
  _Base_ptr local_100;
  undefined1 local_f8;
  allocator local_e9;
  value_type local_e8;
  _Base_ptr local_c8;
  undefined1 local_c0;
  allocator local_b1;
  value_type local_b0;
  _Base_ptr local_90;
  undefined1 local_88;
  allocator local_79;
  value_type local_78;
  allocator local_41;
  undefined1 local_40 [8];
  string v;
  size_t len;
  char *val_local;
  
  if (val == (char *)0x0) {
    val_local._7_1_ = false;
  }
  else {
    sVar3 = strlen(val);
    if (sVar3 < 5) {
      v.field_2._8_8_ = sVar3;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_40,val,sVar3,&local_41);
      std::allocator<char>::~allocator((allocator<char> *)&local_41);
      if ((IsOn(char_const*)::onValues_abi_cxx11_ == '\0') &&
         (iVar2 = __cxa_guard_acquire(&IsOn(char_const*)::onValues_abi_cxx11_), iVar2 != 0)) {
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::set(&IsOn(char_const*)::onValues_abi_cxx11_);
        __cxa_atexit(std::
                     set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::~set,&IsOn(char_const*)::onValues_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&IsOn(char_const*)::onValues_abi_cxx11_);
      }
      bVar1 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&IsOn(char_const*)::onValues_abi_cxx11_);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_78,"ON",&local_79);
        pVar6 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::insert(&IsOn(char_const*)::onValues_abi_cxx11_,&local_78);
        local_90 = (_Base_ptr)pVar6.first._M_node;
        local_88 = pVar6.second;
        std::__cxx11::string::~string((string *)&local_78);
        std::allocator<char>::~allocator((allocator<char> *)&local_79);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_b0,"1",&local_b1);
        pVar6 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::insert(&IsOn(char_const*)::onValues_abi_cxx11_,&local_b0);
        local_c8 = (_Base_ptr)pVar6.first._M_node;
        local_c0 = pVar6.second;
        std::__cxx11::string::~string((string *)&local_b0);
        std::allocator<char>::~allocator((allocator<char> *)&local_b1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_e8,"YES",&local_e9);
        pVar6 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::insert(&IsOn(char_const*)::onValues_abi_cxx11_,&local_e8);
        local_100 = (_Base_ptr)pVar6.first._M_node;
        local_f8 = pVar6.second;
        std::__cxx11::string::~string((string *)&local_e8);
        std::allocator<char>::~allocator((allocator<char> *)&local_e9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_120,"TRUE",&local_121);
        pVar6 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::insert(&IsOn(char_const*)::onValues_abi_cxx11_,&local_120);
        local_138 = (_Base_ptr)pVar6.first._M_node;
        local_130 = pVar6.second;
        std::__cxx11::string::~string((string *)&local_120);
        std::allocator<char>::~allocator((allocator<char> *)&local_121);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_158,"Y",&local_159);
        pVar6 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::insert(&IsOn(char_const*)::onValues_abi_cxx11_,&local_158);
        c._M_current = (char *)pVar6.first._M_node;
        std::__cxx11::string::~string((string *)&local_158);
        std::allocator<char>::~allocator((allocator<char> *)&local_159);
      }
      local_178._M_current = (char *)std::__cxx11::string::begin();
      while( true ) {
        local_180._M_current = (char *)std::__cxx11::string::end();
        bVar1 = __gnu_cxx::operator!=(&local_178,&local_180);
        if (!bVar1) break;
        pcVar4 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_178);
        iVar2 = toupper((int)*pcVar4);
        pcVar4 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_178);
        *pcVar4 = (char)iVar2;
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&local_178,0);
      }
      sVar5 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(&IsOn(char_const*)::onValues_abi_cxx11_,(key_type *)local_40);
      val_local._7_1_ = sVar5 != 0;
      std::__cxx11::string::~string((string *)local_40);
    }
    else {
      val_local._7_1_ = false;
    }
  }
  return val_local._7_1_;
}

Assistant:

bool cmSystemTools::IsOn(const char* val)
{
  if (!val) {
    return false;
  }
  size_t len = strlen(val);
  if (len > 4) {
    return false;
  }
  std::string v(val, len);

  static std::set<std::string> onValues;
  if (onValues.empty()) {
    onValues.insert("ON");
    onValues.insert("1");
    onValues.insert("YES");
    onValues.insert("TRUE");
    onValues.insert("Y");
  }
  for (std::string::iterator c = v.begin(); c != v.end(); c++) {
    *c = static_cast<char>(toupper(*c));
  }
  return (onValues.count(v) > 0);
}